

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O2

void __thiscall
DirectChainedMap<IdentifierLookupResult>::rehash(DirectChainedMap<IdentifierLookupResult> *this)

{
  uint uVar1;
  Node *pNVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar4;
  
  uVar1 = this->bucketCount;
  pNVar2 = this->data;
  this->bucketCount = uVar1 * 2;
  this->count = 0;
  iVar3 = (*this->allocator->_vptr_Allocator[2])();
  this->data = (Node *)CONCAT44(extraout_var,iVar3);
  NULLC::fillMemory((Node *)CONCAT44(extraout_var,iVar3),0,(ulong)this->bucketCount << 5);
  for (lVar4 = 0; (ulong)uVar1 << 5 != lVar4; lVar4 = lVar4 + 0x20) {
    if (*(long *)(pNVar2 + lVar4 + 0x18) != 0) {
      rehash_insert_reverse(this,pNVar2 + lVar4,pNVar2 + lVar4);
    }
  }
  (*this->allocator->_vptr_Allocator[3])(this->allocator,pNVar2);
  return;
}

Assistant:

void rehash()
	{
		unsigned oldBucketCount = bucketCount;
		Node *oldData = data;

		bucketCount *= 2;
		count = 0;

		data = (Node*)allocator->alloc(sizeof(Node) * bucketCount);
		NULLC::fillMemory(data, 0, sizeof(Node) * bucketCount);

		for(unsigned i = 0; i < oldBucketCount; i++)
		{
			Node *start = &oldData[i];

			if(start->next == NULL)
				continue;

			rehash_insert_reverse(start, start);
		}

		allocator->dealloc(oldData);
	}